

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.h
# Opt level: O0

AffineSpace3fa * __thiscall
embree::Geometry::getTransform(Geometry *this,size_t instance,float time)

{
  exception *this_00;
  allocator local_69;
  string local_68 [80];
  string *local_18;
  undefined4 local_c;
  exception *local_8;
  
  this_00 = (exception *)__cxa_allocate_exception(0x30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"operation not supported for this geometry",&local_69);
  local_c = 3;
  local_18 = local_68;
  local_8 = this_00;
  std::exception::exception(this_00);
  *(undefined ***)this_00 = &PTR__rtcore_error_005b1508;
  *(undefined4 *)(this_00 + 8) = local_c;
  std::__cxx11::string::string((string *)(this_00 + 0x10),local_18);
  __cxa_throw(this_00,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
}

Assistant:

virtual AffineSpace3fa getTransform(size_t instance, float time) {
      throw_RTCError(RTC_ERROR_INVALID_OPERATION,"operation not supported for this geometry");
    }